

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_base_offset_addr(DisasContext_conflict6 *ctx,TCGv_i64 addr,int base,int offset)

{
  TCGContext_conflict6 *tcg_ctx;
  TCGContext_conflict6 *tcg_ctx_00;
  TCGv_i64 a2;
  uintptr_t o;
  TCGOpcode opc;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  if (base == 0) {
    a2 = (TCGv_i64)(long)offset;
    opc = INDEX_op_movi_i64;
LAB_0099915d:
    tcg_gen_op2_mips64el(tcg_ctx,opc,(TCGArg)(addr + (long)tcg_ctx),(TCGArg)a2);
    return;
  }
  if (offset == 0) {
    if (tcg_ctx->cpu_gpr[base] != addr) {
      a2 = tcg_ctx->cpu_gpr[base] + (long)tcg_ctx;
      opc = INDEX_op_mov_i64;
      goto LAB_0099915d;
    }
  }
  else {
    tcg_gen_op2_mips64el
              (tcg_ctx,INDEX_op_movi_i64,(TCGArg)(addr + (long)&tcg_ctx->pool_cur),(long)offset);
    tcg_ctx_00 = ctx->uc->tcg_ctx;
    tcg_gen_op3_mips64el
              (tcg_ctx_00,INDEX_op_add_i64,(TCGArg)(addr + (long)&tcg_ctx_00->pool_cur),
               (TCGArg)((long)&tcg_ctx_00->pool_cur + (long)tcg_ctx->cpu_gpr[base]),
               (TCGArg)(addr + (long)&tcg_ctx_00->pool_cur));
    if ((ctx->hflags & 0x200) != 0) {
      tcg_gen_ext32s_i64_mips64el(tcg_ctx_00,addr,addr);
      return;
    }
  }
  return;
}

Assistant:

static void gen_base_offset_addr(DisasContext *ctx, TCGv addr,
                                 int base, int offset)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    if (base == 0) {
        tcg_gen_movi_tl(tcg_ctx, addr, offset);
    } else if (offset == 0) {
        gen_load_gpr(tcg_ctx, addr, base);
    } else {
        tcg_gen_movi_tl(tcg_ctx, addr, offset);
        gen_op_addr_add(ctx, addr, tcg_ctx->cpu_gpr[base], addr);
    }
}